

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O3

size_t __thiscall tracing_layer::APITracerContextImp::updateTracerArrays(APITracerContextImp *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  undefined1 auVar3 [16];
  __pointer_type ptVar4;
  tracer_array_entry_t *__dest;
  _List_node_base *p_Var5;
  size_t sVar6;
  ulong uVar7;
  
  uVar7 = (this->enabledTracerImpList).
          super__List_base<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>
          ._M_impl._M_node._M_size;
  if (uVar7 == 0) {
    ptVar4 = &this->emptyTracerArray;
  }
  else {
    ptVar4 = (__pointer_type)operator_new(0x10);
    ptVar4->tracerArrayCount = uVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0xcb8),8) == 0) {
      uVar7 = SUB168(auVar3 * ZEXT816(0xcb8),0);
    }
    __dest = (tracer_array_entry_t *)operator_new__(uVar7);
    ptVar4->tracerArrayEntries = __dest;
    for (p_Var2 = (this->enabledTracerImpList).
                  super__List_base<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)&this->enabledTracerImpList; p_Var2 = p_Var2->_M_next) {
      memcpy(__dest,&(p_Var2[1]._M_next)->_M_prev,0xcb8);
      __dest = __dest + 1;
    }
  }
  p_Var2 = (_List_node_base *)(this->activeTracerArray)._M_b._M_p;
  if ((_List_node_base *)&this->emptyTracerArray != p_Var2) {
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->retiringTracerArrayList).
              super__List_base<tracing_layer::tracerArray_*,_std::allocator<tracing_layer::tracerArray_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  (this->activeTracerArray)._M_b._M_p = ptVar4;
  sVar6 = testAndFreeRetiredTracers(this);
  return sVar6;
}

Assistant:

size_t APITracerContextImp::updateTracerArrays() {
    tracer_array_t *newTracerArray;
    size_t newTracerArrayCount = this->enabledTracerImpList.size();

    if (newTracerArrayCount != 0) {

        newTracerArray = new tracer_array_t;

        newTracerArray->tracerArrayCount = newTracerArrayCount;
        newTracerArray->tracerArrayEntries =
            new tracer_array_entry_t[newTracerArrayCount];
        //
        // iterate over the list of enabled tracers, copying their entries into the
        // new tracer array
        //
        size_t i = 0;
        std::list<struct APITracerImp *>::iterator itr;
        for (itr = enabledTracerImpList.begin(); itr != enabledTracerImpList.end();
             itr++) {
            newTracerArray->tracerArrayEntries[i] = (*itr)->tracerFunctions;
            i++;
        }

    } else {
        newTracerArray = &emptyTracerArray;
    }
    //
    // active_tracer_array.load can use memory_order_relaxed here because
    // there is logically no transfer of other memory context between
    // threads in this case.
    //
    tracer_array_t *active_tracer_array_shadow =
        activeTracerArray.load(std::memory_order_relaxed);
    if (active_tracer_array_shadow != &emptyTracerArray) {
        retiringTracerArrayList.push_back(active_tracer_array_shadow);
    }
    //
    // This active_tracer_array.store must use memory_order_release.
    // This store DOES signal a logical transfer of tracer state information
    // from this thread to the tracing threads.
    //
    activeTracerArray.store(newTracerArray, std::memory_order_release);
    return testAndFreeRetiredTracers();
}